

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O2

void EBPLM::PredictVelOnZFace
               (Box *zebox,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  BCRec *bcrec;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  EBCellFlag *pEVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  undefined1 auVar67 [16];
  undefined8 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  int iVar81;
  bool bVar82;
  pair<bool,_bool> pVar83;
  pair<bool,_bool> pVar84;
  pair<bool,_bool> pVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  ulong uVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  Real (*paRVar123) [3];
  double *pdVar124;
  Real *pRVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  char cVar135;
  int dir;
  int dir_00;
  long lVar136;
  long lVar137;
  long lVar138;
  double *pdVar139;
  long lVar140;
  int jj_1;
  int iVar141;
  int iVar142;
  int iVar143;
  long lVar144;
  long lVar145;
  double *pdVar146;
  double *pdVar147;
  long lVar148;
  double *pdVar149;
  double *pdVar150;
  int iVar151;
  int iVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  int iVar157;
  int iVar158;
  long lVar159;
  long lVar160;
  long lVar161;
  int iVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  int iVar166;
  long lVar167;
  long lVar168;
  long lVar169;
  int cuts_x;
  int iVar170;
  long lVar171;
  int iVar172;
  long lVar173;
  int k;
  int iVar174;
  int iVar175;
  long lVar176;
  long lVar177;
  long lVar178;
  char cVar179;
  int j;
  int iVar180;
  int iVar181;
  long lVar182;
  long lVar183;
  long lVar184;
  long lVar185;
  ulong uVar186;
  double dVar187;
  Real RVar188;
  double dVar189;
  double dVar190;
  ulong uVar191;
  double dVar192;
  double dVar193;
  undefined1 auVar194 [16];
  double dVar195;
  double dVar196;
  double dVar198;
  undefined1 auVar197 [16];
  double dVar199;
  double dVar200;
  double dVar203;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  double dVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  double dVar207;
  ulong uVar208;
  double dVar209;
  undefined4 uVar210;
  undefined4 uVar211;
  undefined4 uVar212;
  undefined4 uVar213;
  undefined4 uVar214;
  undefined4 uVar215;
  double dVar216;
  double dVar217;
  Real delta_x;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double local_978;
  double *local_908;
  double *local_8b0;
  double *local_878;
  double *local_870;
  double *local_868;
  double *local_7c0;
  double *local_7b8;
  double *local_7b0;
  double *local_7a8;
  double local_788 [112];
  double local_408;
  double local_400;
  double dStack_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  Real du [27];
  Real A [27] [3];
  
  dVar187 = dt / (geom->super_CoordSys).dx[2];
  iVar175 = (geom->domain).smallend.vect[0];
  iVar181 = (geom->domain).smallend.vect[1];
  iVar172 = (geom->domain).bigend.vect[0];
  iVar4 = (geom->domain).bigend.vect[1];
  iVar5 = (geom->domain).smallend.vect[2];
  iVar6 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar83 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,0,iVar5);
  pVar84 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,1,dir);
  pVar85 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar83 & 1) == 0) || (iVar175 < (zebox->smallend).vect[0] + -1)) {
    iVar7 = (zebox->bigend).vect[0];
    if (((iVar7 < iVar172 || ((ushort)pVar83 >> 8 & 1) == 0) &&
        ((((ushort)pVar85 & 1) == 0 || (iVar5 < (zebox->smallend).vect[2] + -1)))) &&
       (((((ushort)pVar85 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar6)) &&
        (((((ushort)pVar84 & 1) == 0 || (iVar181 < (zebox->smallend).vect[1] + -1)) &&
         ((((ushort)pVar84 >> 8 & 1) == 0 || ((zebox->bigend).vect[1] < iVar4)))))))) {
      lVar29 = ccc->nstride;
      iVar175 = (ccc->begin).z;
      lVar163 = (long)(zebox->smallend).vect[2];
      lVar30 = ccc->kstride;
      lVar129 = (~(long)iVar175 + lVar163) * lVar30;
      iVar181 = (zebox->smallend).vect[0];
      lVar90 = (long)iVar181;
      uVar8 = (ccc->begin).x;
      lVar153 = (long)(int)uVar8;
      iVar172 = (q->begin).z;
      lVar176 = (long)iVar172;
      lVar31 = q->kstride;
      iVar4 = (q->begin).x;
      lVar177 = (long)iVar4;
      pdVar32 = q->p;
      lVar33 = q->jstride;
      lVar34 = q->nstride;
      iVar5 = (q->begin).y;
      uVar91 = (ulong)iVar5;
      pdVar35 = ccvel->p;
      lVar36 = ccvel->jstride;
      lVar37 = ccvel->kstride;
      lVar38 = ccvel->nstride;
      lVar159 = (long)(ccvel->begin).x;
      iVar6 = (ccvel->begin).y;
      lVar160 = (long)(ccvel->begin).z;
      pdVar39 = Imz->p;
      lVar40 = Imz->jstride;
      lVar41 = Imz->kstride;
      lVar42 = Imz->nstride;
      iVar7 = (Imz->begin).x;
      iVar9 = (Imz->begin).y;
      iVar10 = (Imz->begin).z;
      pdVar43 = Ipz->p;
      lVar44 = Ipz->jstride;
      lVar45 = Ipz->kstride;
      lVar46 = Ipz->nstride;
      iVar11 = (Ipz->begin).x;
      iVar12 = (Ipz->begin).y;
      uVar13 = (Ipz->begin).z;
      pEVar47 = flag->p;
      lVar48 = flag->jstride;
      lVar49 = flag->kstride;
      iVar14 = (flag->begin).x;
      iVar143 = (flag->begin).y;
      lVar144 = (long)(flag->begin).z;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      uVar15 = (vfrac->begin).x;
      lVar173 = (long)(int)uVar15;
      uVar16 = (vfrac->begin).y;
      lVar145 = (long)(int)uVar16;
      iVar17 = (vfrac->begin).z;
      lVar167 = (long)iVar17;
      pdVar53 = ccc->p;
      lVar54 = ccc->jstride;
      iVar18 = (ccc->begin).y;
      pdVar55 = fcx->p;
      lVar56 = fcx->jstride;
      lVar57 = fcx->kstride;
      lVar58 = fcx->nstride;
      iVar19 = (fcx->begin).x;
      iVar20 = (fcx->begin).y;
      lVar182 = (long)(fcx->begin).z;
      pdVar59 = fcy->p;
      lVar60 = fcy->jstride;
      lVar61 = fcy->kstride;
      lVar62 = fcy->nstride;
      lVar183 = (long)(fcy->begin).x;
      iVar21 = (fcy->begin).y;
      lVar184 = (long)(fcy->begin).z;
      pdVar63 = fcz->p;
      lVar64 = fcz->jstride;
      lVar65 = fcz->kstride;
      lVar66 = fcz->nstride;
      lVar185 = (long)(fcz->begin).x;
      iVar22 = (fcz->begin).y;
      iVar23 = (fcz->begin).z;
      iVar24 = (zebox->smallend).vect[1];
      iVar25 = (zebox->bigend).vect[0];
      iVar26 = (zebox->bigend).vect[1];
      iVar27 = (zebox->bigend).vect[2];
      local_8b0 = pdVar32 + ((((lVar163 - lVar176) + -2) * lVar31 + lVar90 + -1) - lVar177);
      lVar140 = 0;
      do {
        if (lVar140 == 3) {
          return;
        }
        lVar130 = lVar140 * lVar34;
        local_908 = local_8b0;
        lVar131 = lVar163;
        local_878 = pdVar53 + ((lVar29 * 2 + lVar129 + lVar90 + -1) - lVar153);
        local_870 = pdVar53 + ((lVar29 + lVar129 + lVar90 + -1) - lVar153);
        local_868 = pdVar53 + ((lVar129 + lVar90 + -1) - lVar153);
        while (lVar131 <= iVar27) {
          lVar1 = lVar131 + -1;
          lVar121 = lVar131 + -2;
          lVar2 = lVar131 + 1;
          lVar92 = (lVar131 - lVar167) * lVar52;
          lVar93 = (lVar1 - lVar167) * lVar52;
          lVar94 = (lVar121 - lVar167) * lVar52;
          lVar95 = (lVar2 - lVar167) * lVar52;
          lVar96 = (lVar131 - lVar176) * lVar31;
          lVar97 = (lVar131 - lVar160) * lVar37;
          lVar98 = (lVar1 - lVar176) * lVar31;
          lVar99 = (lVar2 - lVar176) * lVar31;
          lVar100 = (lVar121 - lVar176) * lVar31;
          lVar101 = (lVar131 - iVar23) * lVar65;
          lVar102 = (lVar131 - iVar175) * lVar30;
          iVar126 = (int)lVar131;
          iVar86 = iVar126 - iVar172;
          lVar103 = iVar86 * lVar31;
          lVar104 = (lVar131 - lVar184) * lVar61;
          lVar105 = (lVar131 - lVar182) * lVar57;
          iVar157 = (int)lVar2;
          lVar106 = (iVar157 - iVar17) * lVar52;
          lVar107 = ((int)lVar121 - iVar17) * lVar52;
          lVar136 = ((int)lVar121 - iVar172) * lVar31;
          iVar87 = (int)lVar1 - iVar175;
          iVar88 = (int)lVar1 - iVar172;
          lVar108 = iVar88 * lVar31;
          lVar109 = (lVar1 - lVar184) * lVar61;
          lVar110 = (lVar1 - lVar182) * lVar57;
          lVar154 = (lVar1 - lVar160) * lVar37;
          lVar121 = (long)iVar24;
          while (lVar121 <= iVar26) {
            if (iVar25 < iVar181) {
              lVar121 = lVar121 + 1;
            }
            else {
              lVar111 = (lVar121 - iVar143) * lVar48;
              lVar112 = (lVar121 - lVar145) * lVar51;
              lVar113 = (lVar121 - uVar91) * lVar33;
              lVar114 = (lVar121 - iVar6) * lVar36;
              lVar115 = (lVar121 - iVar22) * lVar64;
              lVar116 = (lVar121 - iVar18) * lVar54;
              iVar180 = (int)lVar121;
              iVar89 = iVar180 - iVar5;
              lVar117 = iVar89 * lVar33;
              lVar118 = ((lVar121 + -1) - lVar145) * lVar51;
              lVar3 = lVar121 + 1;
              lVar137 = (lVar3 - lVar145) * lVar51;
              lVar148 = ((lVar121 + -1) - uVar91) * lVar33;
              lVar155 = (lVar3 - uVar91) * lVar33;
              lVar161 = ((int)lVar3 - iVar21) * lVar60;
              lVar164 = (lVar121 - iVar21) * lVar60;
              lVar168 = (lVar121 - iVar20) * lVar56;
              lVar171 = (int)(~uVar16 + iVar180) * lVar51;
              lVar178 = (int)((int)lVar3 - uVar16) * lVar51;
              lVar119 = lVar121 - iVar12;
              lVar120 = lVar121 - iVar9;
              lVar132 = (~(long)iVar18 + lVar121) * lVar54 * 8;
              local_7b0 = (double *)((long)local_878 + lVar132);
              local_7b8 = (double *)((long)local_870 + lVar132);
              local_7a8 = (double *)(lVar132 + (long)local_868);
              local_7c0 = (double *)((lVar121 + ~uVar91) * lVar33 * 8 + (long)local_908);
              lVar132 = lVar90;
              iVar80 = iVar181 - iVar4;
              iVar81 = (iVar181 - iVar4) + -1;
              do {
                lVar121 = lVar132 - iVar14;
                uVar28 = pEVar47[lVar111 + lVar121 + (lVar131 - lVar144) * lVar49].flag;
                dVar216 = 0.0;
                dVar220 = 0.0;
                if ((uVar28 >> 9 & 1) != 0) {
                  lVar138 = lVar132 - lVar173;
                  dVar204 = pdVar50[lVar112 + lVar138 + lVar92];
                  iVar151 = (int)lVar132;
                  if ((((dVar204 != 1.0) || (NAN(dVar204))) ||
                      (pdVar50[lVar112 + lVar138 + lVar93] != 1.0)) ||
                     (NAN(pdVar50[lVar112 + lVar138 + lVar93]))) {
LAB_003e6733:
                    lVar133 = lVar132 - lVar185;
                    dVar220 = pdVar63[lVar115 + lVar133 + lVar101];
                    dVar192 = (pdVar63 + lVar115 + lVar133 + lVar101)[lVar66];
                    lVar122 = lVar132 - lVar153;
                    dVar193 = pdVar53[lVar102 + lVar116 + lVar122 + lVar29 * 2];
                    dVar195 = pdVar53[lVar102 + lVar116 + lVar122];
                    dVar196 = pdVar53[lVar102 + lVar116 + lVar122 + lVar29];
                    iVar152 = iVar151 - iVar4;
                    lVar134 = (long)iVar152;
                    dVar200 = pdVar32[lVar117 + lVar134 + lVar103 + lVar130];
                    dVar222 = pdVar32[lVar117 + lVar134 + lVar98 + lVar130];
                    cVar135 = '\x05';
                    pdVar124 = local_7b8;
                    pdVar146 = local_7b0;
                    pdVar149 = local_7a8;
                    iVar158 = 0;
                    for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                      pdVar139 = pdVar124;
                      pdVar147 = pdVar146;
                      pdVar150 = pdVar149;
                      iVar166 = iVar158;
                      cVar179 = cVar135;
                      for (lVar156 = -1; iVar158 = iVar158 + 3, lVar156 != 2; lVar156 = lVar156 + 1)
                      {
                        lVar169 = (long)iVar166;
                        paRVar123 = A + lVar169;
                        iVar166 = iVar166 + 3;
                        for (lVar165 = 0; iVar158 - lVar169 != lVar165; lVar165 = lVar165 + 1) {
                          iVar127 = (int)lVar165 + -1;
                          if ((((int)lVar156 == 0 && (int)lVar122 == 0) && iVar127 == 0) ||
                             ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) == 0)) {
                            (*paRVar123)[0] = 0.0;
                            (*paRVar123)[1] = 0.0;
                            (*paRVar123)[2] = 0.0;
                          }
                          else {
                            dVar216 = pdVar139[lVar165];
                            (*paRVar123)[0] = (pdVar150[lVar165] + (double)iVar127) - dVar195;
                            (*paRVar123)[1] = (dVar216 + (double)(int)lVar156) - dVar196;
                            (*paRVar123)[2] = (pdVar147[lVar165] + (double)(int)lVar122) - dVar193;
                          }
                          paRVar123 = paRVar123 + 1;
                        }
                        pdVar147 = pdVar147 + lVar54;
                        pdVar139 = pdVar139 + lVar54;
                        pdVar150 = pdVar150 + lVar54;
                        cVar179 = cVar179 + '\x03';
                      }
                      pdVar146 = pdVar146 + lVar30;
                      pdVar124 = pdVar124 + lVar30;
                      pdVar149 = pdVar149 + lVar30;
                      cVar135 = cVar135 + '\t';
                      iVar158 = iVar166;
                    }
                    iVar158 = 0;
                    cVar135 = '\x05';
                    for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                      iVar166 = iVar158;
                      cVar179 = cVar135;
                      for (lVar156 = -1; iVar166 = iVar166 + 3, lVar156 != 2; lVar156 = lVar156 + 1)
                      {
                        lVar165 = (long)iVar158;
                        iVar158 = iVar158 + 3;
                        for (lVar169 = 0; iVar166 - lVar165 != lVar169; lVar169 = lVar169 + 1) {
                          RVar188 = 0.0;
                          if (((int)lVar169 != 1 || ((int)lVar156 != 0 || (int)lVar122 != 0)) &&
                             ((1 << (cVar179 + (char)lVar169 & 0x1fU) & uVar28) != 0)) {
                            RVar188 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                        (iVar89 + (int)lVar156) * lVar33 +
                                                        (long)(iVar81 + (int)lVar169)] - dVar200;
                          }
                          du[lVar165 + lVar169] = RVar188;
                        }
                        cVar179 = cVar179 + '\x03';
                      }
                      cVar135 = cVar135 + '\t';
                    }
                    pdVar124 = &local_408;
                    for (lVar122 = 0; lVar122 != 3; lVar122 = lVar122 + 1) {
                      for (lVar156 = -0x48; lVar156 != 0; lVar156 = lVar156 + 0x18) {
                        *(undefined8 *)((long)pdVar124 + lVar156 + 0x48) = 0;
                      }
                      local_788[lVar122] = 0.0;
                      pdVar124 = pdVar124 + 1;
                    }
                    pRVar125 = A[0] + 2;
                    dVar216 = local_788[0];
                    dVar217 = local_408;
                    dVar223 = dStack_3e0;
                    dVar224 = local_400;
                    dVar199 = local_3e8;
                    dVar203 = dStack_3f8;
                    dVar218 = local_3c8;
                    dVar207 = local_788[1];
                    dVar209 = local_788[2];
                    for (lVar122 = 0; lVar122 != 0x1b; lVar122 = lVar122 + 1) {
                      dVar190 = (*(Real (*) [3])(pRVar125 + -2))[0];
                      dVar198 = pRVar125[-1];
                      dVar189 = *pRVar125;
                      dVar199 = dVar199 + dVar198 * pRVar125[-1];
                      dVar203 = dVar203 + dVar190 * *pRVar125;
                      dVar223 = dVar223 + dVar189 * dVar198;
                      dVar224 = dVar224 + dVar198 * dVar190;
                      dVar218 = dVar218 + dVar189 * dVar189;
                      dVar189 = du[lVar122];
                      dVar216 = dVar216 + dVar190 * dVar189;
                      dVar217 = dVar217 + dVar190 * dVar190;
                      dVar207 = dVar207 + dVar189 * pRVar125[-1];
                      dVar209 = dVar209 + dVar189 * *pRVar125;
                      pRVar125 = pRVar125 + 3;
                    }
                    dVar190 = dVar224 * dVar218 - dVar203 * dVar223;
                    dVar198 = dVar224 * dVar209 - dVar203 * dVar207;
                    dVar189 = dVar224 * dVar223 + dVar203 * -dVar199;
                    dVar219 = dVar218 * dVar199 - dVar223 * dVar223;
                    dVar218 = dVar218 * dVar207 - dVar223 * dVar209;
                    auVar205._0_8_ =
                         dVar203 * (dVar223 * dVar207 - dVar209 * dVar199) +
                         (dVar216 * dVar219 - dVar218 * dVar224);
                    auVar205._8_8_ = dVar203 * dVar198 + (dVar217 * dVar218 - dVar190 * dVar216);
                    dVar203 = dVar189 * dVar203 + (dVar219 * dVar217 - dVar190 * dVar224);
                    auVar206._8_8_ = dVar203;
                    auVar206._0_8_ = dVar203;
                    auVar206 = divpd(auVar205,auVar206);
                    dVar203 = (dVar189 * dVar216 +
                              ((dVar209 * dVar199 + -dVar207 * dVar223) * dVar217 -
                              dVar198 * dVar224)) / dVar203;
                    dVar217 = auVar206._0_8_;
                    dVar223 = auVar206._8_8_;
                    if ((dVar204 == 1.0) && (!NAN(dVar204))) {
                      if ((pdVar50[lVar112 + lVar92 + ((lVar132 + -1) - lVar173)] == 1.0) &&
                         (!NAN(pdVar50[lVar112 + lVar92 + ((lVar132 + -1) - lVar173)]))) {
                        if ((pdVar50[lVar112 + lVar92 + ((lVar132 + 1) - lVar173)] == 1.0) &&
                           (!NAN(pdVar50[lVar112 + lVar92 + ((lVar132 + 1) - lVar173)]))) {
                          dVar199 = dVar200 - pdVar32[lVar117 + lVar103 + lVar130 + ((lVar132 + -1)
                                                                                    - lVar177)];
                          dVar218 = pdVar32[lVar117 + lVar103 + lVar130 + ((lVar132 + 1) - lVar177)]
                                    - dVar200;
                          dVar199 = dVar199 + dVar199;
                          dVar218 = dVar218 + dVar218;
                          dVar217 = (pdVar32[lVar117 + lVar103 + lVar130 + ((lVar132 + 1) - lVar177)
                                            ] -
                                    pdVar32[lVar117 + lVar103 + lVar130 + ((lVar132 + -1) - lVar177)
                                           ]) * 0.5;
                          dVar224 = ABS(dVar199);
                          uVar186 = -(ulong)(0.0 < dVar217);
                          dVar217 = ABS(dVar217);
                          dVar216 = ABS(dVar218);
                          if (dVar224 <= dVar217) {
                            dVar217 = dVar224;
                          }
                          if (dVar217 <= dVar216) {
                            dVar216 = dVar217;
                          }
                          uVar191 = -(ulong)(0.0 < dVar199 * dVar218) & (ulong)dVar216;
                          dVar217 = (double)(~uVar186 & (uVar191 ^ 0x8000000000000000) |
                                            uVar186 & uVar191);
                        }
                      }
                      if ((((pdVar50[lVar118 + lVar92 + lVar138] == 1.0) &&
                           (!NAN(pdVar50[lVar118 + lVar92 + lVar138]))) &&
                          (pdVar50[lVar137 + lVar92 + lVar138] == 1.0)) &&
                         (!NAN(pdVar50[lVar137 + lVar92 + lVar138]))) {
                        dVar199 = dVar200 - pdVar32[lVar148 + lVar103 + lVar130 + lVar134];
                        dVar218 = pdVar32[lVar155 + lVar103 + lVar130 + lVar134] - dVar200;
                        dVar199 = dVar199 + dVar199;
                        dVar218 = dVar218 + dVar218;
                        dVar223 = (pdVar32[lVar155 + lVar103 + lVar130 + lVar134] -
                                  pdVar32[lVar148 + lVar103 + lVar130 + lVar134]) * 0.5;
                        dVar224 = ABS(dVar199);
                        uVar186 = -(ulong)(0.0 < dVar223);
                        dVar223 = ABS(dVar223);
                        dVar216 = ABS(dVar218);
                        if (dVar224 <= dVar223) {
                          dVar223 = dVar224;
                        }
                        if (dVar223 <= dVar216) {
                          dVar216 = dVar223;
                        }
                        uVar191 = -(ulong)(0.0 < dVar199 * dVar218) & (ulong)dVar216;
                        dVar223 = (double)(~uVar186 & (uVar191 ^ 0x8000000000000000) |
                                          uVar186 & uVar191);
                      }
                      if (((pdVar50[lVar112 + lVar138 + lVar93] == 1.0) &&
                          (!NAN(pdVar50[lVar112 + lVar138 + lVar93]))) &&
                         ((pdVar50[lVar112 + lVar138 + lVar95] == 1.0 &&
                          (!NAN(pdVar50[lVar112 + lVar138 + lVar95]))))) {
                        dVar203 = pdVar32[lVar117 + lVar134 + lVar99 + lVar130] - dVar200;
                        dVar199 = (dVar200 - dVar222) + (dVar200 - dVar222);
                        dVar203 = dVar203 + dVar203;
                        dVar224 = (pdVar32[lVar117 + lVar134 + lVar99 + lVar130] - dVar222) * 0.5;
                        dVar218 = ABS(dVar199);
                        uVar186 = -(ulong)(0.0 < dVar224);
                        dVar224 = ABS(dVar224);
                        dVar216 = ABS(dVar203);
                        if (dVar218 <= dVar224) {
                          dVar224 = dVar218;
                        }
                        if (dVar224 <= dVar216) {
                          dVar216 = dVar224;
                        }
                        uVar191 = -(ulong)(0.0 < dVar199 * dVar203) & (ulong)dVar216;
                        dVar203 = (double)(~uVar186 & (uVar191 ^ 0x8000000000000000) |
                                          uVar186 & uVar191);
                      }
                    }
                    dVar216 = dVar222;
                    if (dVar200 <= dVar222) {
                      dVar216 = dVar200;
                    }
                    dVar192 = dVar192 - dVar196;
                    if (dVar222 <= dVar200) {
                      dVar222 = dVar200;
                    }
                    dVar220 = dVar220 - dVar195;
                    iVar128 = 0;
                    iVar166 = 0;
                    iVar158 = 0;
                    iVar170 = 0;
                    iVar127 = -1;
                    while (iVar127 != 2) {
                      iVar141 = iVar128;
                      iVar142 = -1;
                      while (iVar142 != 2) {
                        for (iVar162 = 5; iVar162 != 8; iVar162 = iVar162 + 1) {
                          if (((uVar28 >> (iVar162 + iVar141 & 0x1fU) & 1) != 0) &&
                             ((iVar162 != 6 || iVar142 != 0) || iVar127 != 0)) {
                            iVar170 = iVar170 + (uint)((iVar162 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar142 == 0 && iVar127 == 0));
                            iVar158 = iVar158 + (uint)((iVar162 == 6 && iVar127 == 0) &&
                                                      (iVar142 == 1 || iVar142 + 1 == 0));
                            iVar166 = iVar166 + (uint)((iVar162 == 6 && iVar142 == 0) &&
                                                      (iVar127 == 1 || iVar127 + 1 == 0));
                          }
                        }
                        iVar141 = iVar141 + 3;
                        iVar142 = iVar142 + 1;
                      }
                      iVar128 = iVar128 + 9;
                      iVar127 = iVar127 + 1;
                    }
                    dVar224 = 2.0;
                    if ((uVar28 >> 0x15 & 1) != 0) {
                      cVar135 = '\b';
                      dVar199 = dVar200;
                      dVar224 = dVar200;
                      for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                        cVar179 = cVar135;
                        for (lVar156 = 0; lVar156 != 2; lVar156 = lVar156 + 1) {
                          for (lVar165 = 0; lVar165 != 3; lVar165 = lVar165 + 1) {
                            if (((int)lVar165 != 1 || ((int)lVar156 != 0 || (int)lVar122 != 0)) &&
                               ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) != 0)) {
                              dVar218 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                          (iVar89 + (int)lVar156) * lVar33 +
                                                          (long)(iVar81 + (int)lVar165)];
                              dVar207 = dVar218;
                              if (dVar218 <= dVar224) {
                                dVar207 = dVar224;
                              }
                              dVar224 = dVar207;
                              if (dVar218 < dVar199) {
                                dVar199 = dVar218;
                              }
                            }
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar218 = (((pdVar59 + lVar161 + lVar104 + (lVar132 - lVar183))[lVar62] -
                                 dVar193) * dVar203 +
                                (0.5 - dVar196) * dVar223 +
                                (pdVar59[lVar161 + lVar104 + (lVar132 - lVar183)] - dVar195) *
                                dVar217 + dVar200) - dVar200;
                      if (dVar218 <= 1e-13) {
                        dVar224 = 1.0;
                        if ((dVar218 < -1e-13) &&
                           (dVar224 = (dVar199 - dVar200) / dVar218, 1.0 <= dVar224)) {
                          dVar224 = 1.0;
                        }
                      }
                      else {
                        dVar224 = (dVar224 - dVar200) / dVar218;
                        if (1.0 <= dVar224) {
                          dVar224 = 1.0;
                        }
                      }
                      if (2.0 <= dVar224) {
                        dVar224 = 2.0;
                      }
                    }
                    uVar211 = SUB84(dVar200,0);
                    uVar213 = (undefined4)((ulong)dVar200 >> 0x20);
                    dVar199 = dVar224;
                    if ((short)uVar28 < 0) {
                      cVar135 = '\x05';
                      uVar214 = 0;
                      uVar215 = 0;
                      uVar210 = uVar211;
                      uVar212 = uVar213;
                      dVar218 = dVar200;
                      for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                        cVar179 = cVar135;
                        for (lVar156 = -1; lVar156 != 1; lVar156 = lVar156 + 1) {
                          for (lVar165 = 0; lVar165 != 3; lVar165 = lVar165 + 1) {
                            if (((int)lVar165 == 1 && ((int)lVar156 == 0 && (int)lVar122 == 0)) ||
                               ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) == 0)) {
                              auVar197._4_4_ = uVar212;
                              auVar197._0_4_ = uVar210;
                              auVar197._12_4_ = uVar215;
                              auVar197._8_4_ = uVar214;
                            }
                            else {
                              dVar199 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                          (iVar89 + (int)lVar156) * lVar33 +
                                                          (long)(iVar81 + (int)lVar165)];
                              dVar207 = dVar199;
                              if (dVar199 <= (double)CONCAT44(uVar212,uVar210)) {
                                dVar207 = (double)CONCAT44(uVar212,uVar210);
                              }
                              auVar197._8_8_ = 0;
                              auVar197._0_8_ = dVar207;
                              if (dVar199 < dVar218) {
                                dVar218 = dVar199;
                              }
                            }
                            uVar210 = auVar197._0_4_;
                            uVar212 = auVar197._4_4_;
                            uVar214 = auVar197._8_4_;
                            uVar215 = auVar197._12_4_;
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar207 = (((pdVar59 + lVar164 + lVar104 + (lVar132 - lVar183))[lVar62] -
                                 dVar193) * dVar203 +
                                (((pdVar59[lVar164 + lVar104 + (lVar132 - lVar183)] - dVar195) *
                                  dVar217 + dVar200) - (dVar196 + 0.5) * dVar223)) - dVar200;
                      if (dVar207 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar207 < -1e-13) &&
                           (dVar199 = (dVar218 - dVar200) / dVar207, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = ((double)CONCAT44(uVar212,uVar210) - dVar200) / dVar207;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar224 <= dVar199) {
                        dVar199 = dVar224;
                      }
                    }
                    dVar224 = dVar199;
                    if ((uVar28 >> 0x13 & 1) != 0) {
                      cVar135 = '\x06';
                      uVar210 = uVar211;
                      uVar212 = uVar213;
                      dVar218 = dVar200;
                      for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                        cVar179 = cVar135;
                        for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                          for (lVar165 = 0; lVar165 != 2; lVar165 = lVar165 + 1) {
                            if ((((int)lVar156 == 0 && (int)lVar122 == 0) && (int)lVar165 == 0) ||
                               ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) == 0)) {
                              dVar207 = (double)CONCAT44(uVar212,uVar210);
                              dVar224 = dVar218;
                            }
                            else {
                              dVar224 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                          (iVar89 + (int)lVar156) * lVar33 +
                                                          (long)(iVar80 + (int)lVar165)];
                              dVar207 = dVar224;
                              if (dVar224 <= (double)CONCAT44(uVar212,uVar210)) {
                                dVar207 = (double)CONCAT44(uVar212,uVar210);
                              }
                              if (dVar218 <= dVar224) {
                                dVar224 = dVar218;
                              }
                            }
                            dVar218 = dVar224;
                            uVar210 = SUB84(dVar207,0);
                            uVar212 = (undefined4)((ulong)dVar207 >> 0x20);
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar207 = (((pdVar55 + lVar168 + lVar105 + ((iVar151 - iVar19) + 1))[lVar58] -
                                 dVar193) * dVar203 +
                                (pdVar55[lVar168 + lVar105 + ((iVar151 - iVar19) + 1)] - dVar196) *
                                dVar223 + (0.5 - dVar195) * dVar217 + dVar200) - dVar200;
                      if (dVar207 <= 1e-13) {
                        dVar224 = 1.0;
                        if ((dVar207 < -1e-13) &&
                           (dVar224 = (dVar218 - dVar200) / dVar207, 1.0 <= dVar224)) {
                          dVar224 = 1.0;
                        }
                      }
                      else {
                        dVar224 = ((double)CONCAT44(uVar212,uVar210) - dVar200) / dVar207;
                        if (1.0 <= dVar224) {
                          dVar224 = 1.0;
                        }
                      }
                      if (dVar199 <= dVar224) {
                        dVar224 = dVar199;
                      }
                    }
                    dVar199 = dVar224;
                    if ((uVar28 >> 0x11 & 1) != 0) {
                      cVar135 = '\x05';
                      dVar218 = dVar200;
                      dVar199 = dVar200;
                      for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                        cVar179 = cVar135;
                        for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                          for (lVar165 = 0; lVar165 != 2; lVar165 = lVar165 + 1) {
                            uVar210 = SUB84(dVar199,0);
                            uVar212 = (undefined4)((ulong)dVar199 >> 0x20);
                            dVar207 = dVar218;
                            if (((int)lVar165 != 1 || ((int)lVar156 != 0 || (int)lVar122 != 0)) &&
                               ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) != 0)) {
                              dVar207 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                          (iVar89 + (int)lVar156) * lVar33 +
                                                          (long)(iVar81 + (int)lVar165)];
                              uVar214 = SUB84(dVar207,0);
                              uVar215 = (int)((ulong)dVar207 >> 0x20);
                              if (dVar207 <= dVar199) {
                                uVar214 = uVar210;
                                uVar215 = uVar212;
                              }
                              uVar210 = uVar214;
                              uVar212 = uVar215;
                              if (dVar218 <= dVar207) {
                                dVar207 = dVar218;
                              }
                            }
                            dVar199 = (double)CONCAT44(uVar212,uVar210);
                            dVar218 = dVar207;
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar207 = (((pdVar55 + lVar168 + lVar105 + (lVar132 - iVar19))[lVar58] -
                                 dVar193) * dVar203 +
                                (pdVar55[lVar168 + lVar105 + (lVar132 - iVar19)] - dVar196) *
                                dVar223 + (dVar200 - (dVar195 + 0.5) * dVar217)) - dVar200;
                      if (dVar207 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar207 < -1e-13) &&
                           (dVar199 = (dVar218 - dVar200) / dVar207, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = (dVar199 - dVar200) / dVar207;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar224 <= dVar199) {
                        dVar199 = dVar224;
                      }
                    }
                    dVar224 = dVar199;
                    if ((uVar28 >> 0x1b & 1) != 0) {
                      cVar135 = '\x0e';
                      dVar218 = dVar200;
                      for (lVar122 = 0; lVar122 != 2; lVar122 = lVar122 + 1) {
                        cVar179 = cVar135;
                        for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                          for (lVar165 = 0; lVar165 != 3; lVar165 = lVar165 + 1) {
                            if (((int)lVar165 == 1 && ((int)lVar156 == 0 && (int)lVar122 == 0)) ||
                               ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) == 0)) {
                              dVar207 = (double)CONCAT44(uVar213,uVar211);
                              dVar224 = dVar218;
                            }
                            else {
                              dVar224 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                          (iVar89 + (int)lVar156) * lVar33 +
                                                          (long)(iVar81 + (int)lVar165)];
                              dVar207 = dVar224;
                              if (dVar224 <= (double)CONCAT44(uVar213,uVar211)) {
                                dVar207 = (double)CONCAT44(uVar213,uVar211);
                              }
                              if (dVar218 <= dVar224) {
                                dVar224 = dVar218;
                              }
                            }
                            dVar218 = dVar224;
                            uVar211 = SUB84(dVar207,0);
                            uVar213 = (undefined4)((ulong)dVar207 >> 0x20);
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar195 = ((0.5 - dVar193) * dVar203 +
                                ((pdVar63 + lVar115 + lVar133 + (iVar157 - iVar23) * lVar65)[lVar66]
                                - dVar196) * dVar223 +
                                (pdVar63[lVar115 + lVar133 + (iVar157 - iVar23) * lVar65] - dVar195)
                                * dVar217 + dVar200) - dVar200;
                      if (dVar195 <= 1e-13) {
                        dVar224 = 1.0;
                        if ((dVar195 < -1e-13) &&
                           (dVar224 = (dVar218 - dVar200) / dVar195, 1.0 <= dVar224)) {
                          dVar224 = 1.0;
                        }
                      }
                      else {
                        dVar224 = ((double)CONCAT44(uVar213,uVar211) - dVar200) / dVar195;
                        if (1.0 <= dVar224) {
                          dVar224 = 1.0;
                        }
                      }
                      if (dVar199 <= dVar224) {
                        dVar224 = dVar199;
                      }
                    }
                    cVar135 = '\x05';
                    dVar195 = dVar200;
                    dVar196 = dVar200;
                    for (lVar122 = -1; lVar122 != 1; lVar122 = lVar122 + 1) {
                      cVar179 = cVar135;
                      for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                        for (lVar165 = 0; lVar165 != 3; lVar165 = lVar165 + 1) {
                          uVar210 = SUB84(dVar195,0);
                          uVar212 = (undefined4)((ulong)dVar195 >> 0x20);
                          uVar211 = uVar210;
                          uVar213 = uVar212;
                          if (((int)lVar165 != 1 || ((int)lVar156 != 0 || (int)lVar122 != 0)) &&
                             ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) != 0)) {
                            dVar199 = pdVar32[lVar130 + (iVar86 + (int)lVar122) * lVar31 +
                                                        (iVar89 + (int)lVar156) * lVar33 +
                                                        (long)(iVar81 + (int)lVar165)];
                            dVar218 = dVar199;
                            if (dVar199 <= dVar196) {
                              dVar218 = dVar196;
                            }
                            uVar211 = SUB84(dVar199,0);
                            uVar213 = (int)((ulong)dVar199 >> 0x20);
                            dVar196 = dVar218;
                            if (dVar195 <= dVar199) {
                              uVar211 = uVar210;
                              uVar213 = uVar212;
                            }
                          }
                          dVar195 = (double)CONCAT44(uVar213,uVar211);
                        }
                        cVar179 = cVar179 + '\x03';
                      }
                      cVar135 = cVar135 + '\t';
                    }
                    dVar199 = ((dVar192 * dVar223 + dVar220 * dVar217 + dVar200) -
                              (dVar193 + 0.5) * dVar203) - dVar200;
                    if (dVar199 <= 1e-13) {
                      dVar196 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar196 = (dVar195 - dVar200) / dVar199, 1.0 <= dVar196)) {
                        dVar196 = 1.0;
                      }
                    }
                    else {
                      dVar196 = (dVar196 - dVar200) / dVar199;
                      if (1.0 <= dVar196) {
                        dVar196 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar196) {
                      dVar196 = dVar224;
                    }
                    dVar195 = 0.0;
                    if (1 < iVar170) {
                      dVar195 = dVar196;
                    }
                    uVar211 = 0;
                    uVar213 = 0;
                    if (1 < iVar158) {
                      uVar211 = SUB84(dVar196,0);
                      uVar213 = (undefined4)((ulong)dVar196 >> 0x20);
                    }
                    dVar224 = 0.0;
                    if (1 < iVar166) {
                      dVar224 = dVar196;
                    }
                    if ((dVar204 != 1.0) || (NAN(dVar204))) {
                      local_978 = pdVar50[lVar112 + lVar138 + lVar93];
                    }
                    else {
                      if ((((pdVar50[lVar112 + lVar92 + (int)(~uVar15 + iVar151)] == 1.0) &&
                           (!NAN(pdVar50[lVar112 + lVar92 + (int)(~uVar15 + iVar151)]))) &&
                          (pdVar50[lVar112 + lVar92 + (int)((iVar151 - uVar15) + 1)] == 1.0)) &&
                         (!NAN(pdVar50[lVar112 + lVar92 + (int)((iVar151 - uVar15) + 1)]))) {
                        dVar195 = 1.0;
                      }
                      if (((pdVar50[lVar171 + lVar92 + lVar138] == 1.0) &&
                          (!NAN(pdVar50[lVar171 + lVar92 + lVar138]))) &&
                         ((pdVar50[lVar178 + lVar92 + lVar138] == 1.0 &&
                          (!NAN(pdVar50[lVar178 + lVar92 + lVar138]))))) {
                        uVar211 = 0;
                        uVar213 = 0x3ff00000;
                      }
                      local_978 = pdVar50[lVar112 + lVar138 + lVar93];
                      if ((local_978 == 1.0) && (!NAN(local_978))) {
                        if ((pdVar50[lVar112 + lVar138 + lVar106] != 1.0) ||
                           (NAN(pdVar50[lVar112 + lVar138 + lVar106]))) {
                          local_978 = 1.0;
                        }
                        else {
                          local_978 = 1.0;
                          dVar224 = 1.0;
                        }
                      }
                    }
                    dVar220 = (-0.5 - dVar193) * dVar203 * dVar224 +
                              dVar192 * dVar223 * (double)CONCAT44(uVar213,uVar211) +
                              dVar220 * dVar217 * dVar195 + dVar200;
                    if (dVar220 <= dVar222) {
                      dVar222 = dVar220;
                    }
                    if (dVar216 <= dVar222) {
                      dVar216 = dVar222;
                    }
                    dVar216 = pdVar35[lVar114 + lVar97 + lVar38 * 2 + (lVar132 - lVar159)] *
                              dVar187 * -0.5 * dVar203 * dVar224 + dVar216;
                    if ((local_978 == 1.0) && (!NAN(local_978))) goto LAB_003e8008;
                    bVar82 = false;
LAB_003e83fb:
                    dVar192 = pdVar63[lVar115 + lVar133 + lVar101];
                    dVar193 = (pdVar63 + lVar115 + lVar133 + lVar101)[lVar66];
                    pdVar124 = pdVar53 + iVar87 * lVar30 +
                                         (iVar180 - iVar18) * lVar54 + (long)(int)(iVar151 - uVar8);
                    dVar195 = pdVar124[lVar29 * 2];
                    dVar196 = *pdVar124;
                    dVar200 = pdVar124[lVar29];
                    dVar222 = pdVar32[lVar117 + lVar134 + lVar96 + lVar130];
                    dVar217 = pdVar32[lVar117 + lVar134 + lVar108 + lVar130];
                    uVar28 = pEVar47[lVar111 + lVar121 + (lVar1 - lVar144) * lVar49].flag;
                    cVar135 = '\x05';
                    iVar158 = 0;
                    for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                      iVar127 = (int)lVar121;
                      iVar166 = iVar158;
                      cVar179 = cVar135;
                      for (lVar122 = -1; iVar158 = iVar158 + 3, lVar122 != 2; lVar122 = lVar122 + 1)
                      {
                        lVar156 = (long)iVar166;
                        paRVar123 = A + lVar156;
                        iVar128 = (int)lVar122;
                        iVar166 = iVar166 + 3;
                        for (lVar165 = 0; iVar158 - lVar156 != lVar165; lVar165 = lVar165 + 1) {
                          iVar170 = (int)lVar165 + -1;
                          if (((iVar128 == 0 && iVar127 == 0) && iVar170 == 0) ||
                             ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) == 0)) {
                            (*paRVar123)[0] = 0.0;
                            (*paRVar123)[1] = 0.0;
                            (*paRVar123)[2] = 0.0;
                          }
                          else {
                            pdVar124 = pdVar53 + (iVar87 + iVar127) * lVar30 +
                                                 ((iVar180 - iVar18) + iVar128) * lVar54 +
                                                 (long)(int)(~uVar8 + iVar151 + (int)lVar165);
                            dVar220 = (pdVar124[lVar29] + (double)iVar128) - dVar200;
                            auVar67._8_4_ = SUB84(dVar220,0);
                            auVar67._0_8_ = (*pdVar124 + (double)iVar170) - dVar196;
                            auVar67._12_4_ = (int)((ulong)dVar220 >> 0x20);
                            *(undefined1 (*) [16])*paRVar123 = auVar67;
                            (*paRVar123)[2] = (pdVar124[lVar29 * 2] + (double)iVar127) - dVar195;
                          }
                          paRVar123 = paRVar123 + 1;
                        }
                        cVar179 = cVar179 + '\x03';
                      }
                      cVar135 = cVar135 + '\t';
                      iVar158 = iVar166;
                    }
                    iVar166 = iVar152 + -1;
                    iVar158 = 0;
                    cVar135 = '\x05';
                    for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                      iVar127 = iVar158;
                      cVar179 = cVar135;
                      for (lVar122 = -1; iVar127 = iVar127 + 3, lVar122 != 2; lVar122 = lVar122 + 1)
                      {
                        lVar156 = (long)iVar158;
                        iVar158 = iVar158 + 3;
                        for (lVar165 = 0; iVar127 - lVar156 != lVar165; lVar165 = lVar165 + 1) {
                          RVar188 = 0.0;
                          if (((int)lVar165 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                             ((1 << (cVar179 + (char)lVar165 & 0x1fU) & uVar28) != 0)) {
                            RVar188 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                        (iVar89 + (int)lVar122) * lVar33 +
                                                        (long)(iVar166 + (int)lVar165)] - dVar217;
                          }
                          du[lVar156 + lVar165] = RVar188;
                        }
                        cVar179 = cVar179 + '\x03';
                      }
                      cVar135 = cVar135 + '\t';
                    }
                    pdVar124 = &local_408;
                    for (lVar121 = 0; lVar121 != 3; lVar121 = lVar121 + 1) {
                      for (lVar122 = -0x48; lVar122 != 0; lVar122 = lVar122 + 0x18) {
                        *(undefined8 *)((long)pdVar124 + lVar122 + 0x48) = 0;
                      }
                      local_788[lVar121] = 0.0;
                      pdVar124 = pdVar124 + 1;
                    }
                    pRVar125 = A[0] + 2;
                    dVar224 = local_408;
                    dVar199 = local_400;
                    dVar203 = local_788[1];
                    dVar218 = local_788[2];
                    dVar207 = local_3c8;
                    dVar220 = local_788[0];
                    dVar223 = dStack_3f8;
                    dVar209 = local_3e8;
                    dVar189 = dStack_3e0;
                    for (lVar121 = 0; lVar121 != 0x1b; lVar121 = lVar121 + 1) {
                      dVar219 = (*(Real (*) [3])(pRVar125 + -2))[0];
                      dVar221 = pRVar125[-1];
                      dVar190 = du[lVar121];
                      dVar224 = dVar224 + dVar219 * dVar219;
                      dVar209 = dVar209 + dVar221 * pRVar125[-1];
                      dVar189 = dVar189 + dVar221 * *pRVar125;
                      dVar198 = *pRVar125;
                      dVar220 = dVar220 + dVar219 * dVar190;
                      dVar223 = dVar223 + dVar219 * dVar198;
                      dVar199 = dVar199 + dVar221 * dVar219;
                      dVar203 = dVar203 + dVar190 * dVar221;
                      dVar218 = dVar218 + dVar198 * dVar190;
                      dVar207 = dVar207 + dVar198 * dVar198;
                      pRVar125 = pRVar125 + 3;
                    }
                    dVar198 = dVar207 * dVar199 + -dVar189 * dVar223;
                    dVar221 = dVar209 * dVar207 - dVar189 * dVar189;
                    dVar219 = dVar199 * dVar189 - dVar209 * dVar223;
                    dVar190 = dVar199 * dVar218 - dVar223 * dVar203;
                    dVar207 = dVar207 * dVar203 - dVar218 * dVar189;
                    auVar201._0_8_ =
                         dVar220 * dVar219 +
                         (dVar224 * (dVar209 * dVar218 - dVar189 * dVar203) - dVar199 * dVar190);
                    auVar201._8_8_ =
                         dVar223 * (dVar203 * dVar189 - dVar209 * dVar218) +
                         (dVar220 * dVar221 - dVar199 * dVar207);
                    dVar199 = dVar219 * dVar223 + (dVar221 * dVar224 - dVar198 * dVar199);
                    auVar194._8_8_ = dVar199;
                    auVar194._0_8_ = dVar199;
                    dVar199 = (dVar190 * dVar223 + (dVar207 * dVar224 - dVar198 * dVar220)) /
                              dVar199;
                    auVar202 = divpd(auVar201,auVar194);
                    if (bVar82) {
                      uVar186 = auVar202._8_8_;
                      if ((pdVar50[lVar112 + lVar93 + ((lVar132 + -1) - lVar173)] == 1.0) &&
                         (!NAN(pdVar50[lVar112 + lVar93 + ((lVar132 + -1) - lVar173)]))) {
                        if ((pdVar50[lVar112 + lVar93 + ((lVar132 + 1) - lVar173)] == 1.0) &&
                           (!NAN(pdVar50[lVar112 + lVar93 + ((lVar132 + 1) - lVar173)]))) {
                          dVar220 = dVar217 - pdVar32[lVar117 + lVar108 + lVar130 + ((lVar132 + -1)
                                                                                    - lVar177)];
                          dVar223 = pdVar32[lVar117 + lVar108 + lVar130 + ((lVar132 + 1) - lVar177)]
                                    - dVar217;
                          dVar220 = dVar220 + dVar220;
                          dVar223 = dVar223 + dVar223;
                          dVar224 = (pdVar32[lVar117 + lVar108 + lVar130 + ((lVar132 + 1) - lVar177)
                                            ] -
                                    pdVar32[lVar117 + lVar108 + lVar130 + ((lVar132 + -1) - lVar177)
                                           ]) * 0.5;
                          dVar218 = ABS(dVar220);
                          uVar186 = -(ulong)(0.0 < dVar224);
                          dVar224 = ABS(dVar224);
                          dVar203 = ABS(dVar223);
                          if (dVar218 <= dVar224) {
                            dVar224 = dVar218;
                          }
                          if (dVar224 <= dVar203) {
                            dVar203 = dVar224;
                          }
                          uVar191 = -(ulong)(0.0 < dVar220 * dVar223) & (ulong)dVar203;
                          uVar186 = ~uVar186 & (uVar191 ^ 0x8000000000000000) | uVar186 & uVar191;
                        }
                      }
                      if ((((pdVar50[lVar118 + lVar93 + lVar138] == 1.0) &&
                           (!NAN(pdVar50[lVar118 + lVar93 + lVar138]))) &&
                          (pdVar50[lVar137 + lVar93 + lVar138] == 1.0)) &&
                         (!NAN(pdVar50[lVar137 + lVar93 + lVar138]))) {
                        dVar220 = dVar217 - pdVar32[lVar148 + lVar108 + lVar130 + lVar134];
                        dVar223 = pdVar32[lVar155 + lVar108 + lVar130 + lVar134] - dVar217;
                        dVar220 = dVar220 + dVar220;
                        dVar223 = dVar223 + dVar223;
                        dVar224 = (pdVar32[lVar155 + lVar108 + lVar130 + lVar134] -
                                  pdVar32[lVar148 + lVar108 + lVar130 + lVar134]) * 0.5;
                        dVar203 = ABS(dVar220);
                        uVar191 = -(ulong)(0.0 < dVar224);
                        dVar224 = ABS(dVar224);
                        dVar199 = ABS(dVar223);
                        if (dVar203 <= dVar224) {
                          dVar224 = dVar203;
                        }
                        if (dVar224 <= dVar199) {
                          dVar199 = dVar224;
                        }
                        uVar208 = -(ulong)(0.0 < dVar220 * dVar223) & (ulong)dVar199;
                        dVar199 = (double)(~uVar191 & (uVar208 ^ 0x8000000000000000) |
                                          uVar191 & uVar208);
                      }
                      auVar202._8_8_ = uVar186;
                      if (((dVar204 == 1.0) && (!NAN(dVar204))) &&
                         ((pdVar50[lVar112 + lVar138 + lVar94] == 1.0 &&
                          (!NAN(pdVar50[lVar112 + lVar138 + lVar94]))))) {
                        dVar203 = dVar217 - pdVar32[lVar117 + lVar134 + lVar100 + lVar130];
                        dVar224 = (dVar222 - dVar217) + (dVar222 - dVar217);
                        dVar203 = dVar203 + dVar203;
                        dVar220 = (dVar222 - pdVar32[lVar117 + lVar134 + lVar100 + lVar130]) * 0.5;
                        dVar218 = ABS(dVar203);
                        uVar191 = -(ulong)(0.0 < dVar220);
                        dVar220 = ABS(dVar220);
                        dVar223 = ABS(dVar224);
                        if (dVar218 <= dVar220) {
                          dVar220 = dVar218;
                        }
                        if (dVar220 <= dVar223) {
                          dVar223 = dVar220;
                        }
                        uVar208 = -(ulong)(0.0 < dVar203 * dVar224) & (ulong)dVar223;
                        auVar202._0_8_ =
                             ~uVar191 & (uVar208 ^ 0x8000000000000000) | uVar191 & uVar208;
                      }
                    }
                    dVar220 = dVar217;
                    if (dVar222 <= dVar217) {
                      dVar220 = dVar222;
                    }
                    dVar193 = dVar193 - dVar200;
                    dVar223 = dVar217;
                    if (dVar217 <= dVar222) {
                      dVar223 = dVar222;
                    }
                    dVar192 = dVar192 - dVar196;
                    iVar170 = 0;
                    iVar141 = 0;
                    iVar127 = 0;
                    iVar158 = 0;
                    iVar128 = -1;
                    while (iVar128 != 2) {
                      iVar142 = iVar170;
                      iVar162 = -1;
                      while (iVar162 != 2) {
                        for (iVar174 = 5; iVar174 != 8; iVar174 = iVar174 + 1) {
                          if (((uVar28 >> (iVar174 + iVar142 & 0x1fU) & 1) != 0) &&
                             ((iVar174 != 6 || iVar162 != 0) || iVar128 != 0)) {
                            iVar158 = iVar158 + (uint)((iVar174 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar162 == 0 && iVar128 == 0));
                            iVar127 = iVar127 + (uint)((iVar174 == 6 && iVar128 == 0) &&
                                                      (iVar162 == 1 || iVar162 + 1 == 0));
                            iVar141 = iVar141 + (uint)((iVar174 == 6 && iVar162 == 0) &&
                                                      (iVar128 == 1 || iVar128 + 1 == 0));
                          }
                        }
                        iVar142 = iVar142 + 3;
                        iVar162 = iVar162 + 1;
                      }
                      iVar170 = iVar170 + 9;
                      iVar128 = iVar128 + 1;
                    }
                    dVar203 = auVar202._8_8_;
                    dVar222 = 2.0;
                    dVar224 = auVar202._0_8_;
                    if ((uVar28 >> 0x15 & 1) != 0) {
                      cVar135 = '\b';
                      dVar222 = dVar217;
                      dVar218 = dVar217;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar179 = cVar135;
                        for (lVar122 = 0; lVar122 != 2; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            if (((int)lVar134 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar179 + (char)lVar134 & 0x1fU) & uVar28) != 0)) {
                              dVar207 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                          (iVar89 + (int)lVar122) * lVar33 +
                                                          (long)(iVar166 + (int)lVar134)];
                              dVar209 = dVar207;
                              if (dVar207 <= dVar222) {
                                dVar209 = dVar222;
                              }
                              dVar222 = dVar209;
                              if (dVar207 < dVar218) {
                                dVar218 = dVar207;
                              }
                            }
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar207 = (((pdVar59 + lVar161 + lVar109 + (lVar132 - lVar183))[lVar62] -
                                 dVar195) * dVar224 +
                                (0.5 - dVar200) * dVar199 +
                                (pdVar59[lVar161 + lVar109 + (lVar132 - lVar183)] - dVar196) *
                                dVar203 + dVar217) - dVar217;
                      if (dVar207 <= 1e-13) {
                        dVar222 = 1.0;
                        if ((dVar207 < -1e-13) &&
                           (dVar222 = (dVar218 - dVar217) / dVar207, 1.0 <= dVar222)) {
                          dVar222 = 1.0;
                        }
                      }
                      else {
                        dVar222 = (dVar222 - dVar217) / dVar207;
                        if (1.0 <= dVar222) {
                          dVar222 = 1.0;
                        }
                      }
                      if (2.0 <= dVar222) {
                        dVar222 = 2.0;
                      }
                    }
                    dVar218 = dVar222;
                    if ((short)uVar28 < 0) {
                      cVar135 = '\x05';
                      pdVar124 = local_7c0;
                      dVar218 = dVar217;
                      dVar207 = dVar217;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        pdVar146 = pdVar124;
                        cVar179 = cVar135;
                        for (lVar122 = -1; lVar122 != 1; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            if (((int)lVar134 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar179 + (char)lVar134 & 0x1fU) & uVar28) != 0)) {
                              dVar209 = pdVar146[lVar134];
                              dVar189 = dVar209;
                              if (dVar209 <= dVar218) {
                                dVar189 = dVar218;
                              }
                              dVar218 = dVar189;
                              if (dVar209 < dVar207) {
                                dVar207 = dVar209;
                              }
                            }
                          }
                          pdVar146 = pdVar146 + lVar33;
                          cVar179 = cVar179 + '\x03';
                        }
                        pdVar124 = pdVar124 + lVar31;
                        cVar135 = cVar135 + '\t';
                      }
                      dVar209 = (((pdVar59 + lVar164 + lVar109 + (lVar132 - lVar183))[lVar62] -
                                 dVar195) * dVar224 +
                                (((pdVar59[lVar164 + lVar109 + (lVar132 - lVar183)] - dVar196) *
                                  dVar203 + dVar217) - (dVar200 + 0.5) * dVar199)) - dVar217;
                      if (dVar209 <= 1e-13) {
                        dVar218 = 1.0;
                        if ((dVar209 < -1e-13) &&
                           (dVar218 = (dVar207 - dVar217) / dVar209, 1.0 <= dVar218)) {
                          dVar218 = 1.0;
                        }
                      }
                      else {
                        dVar218 = (dVar218 - dVar217) / dVar209;
                        if (1.0 <= dVar218) {
                          dVar218 = 1.0;
                        }
                      }
                      if (dVar222 <= dVar218) {
                        dVar218 = dVar222;
                      }
                    }
                    dVar222 = dVar218;
                    if ((uVar28 >> 0x13 & 1) != 0) {
                      cVar135 = '\x06';
                      dVar222 = dVar217;
                      dVar207 = dVar217;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar179 = cVar135;
                        for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 2; lVar134 = lVar134 + 1) {
                            dVar209 = dVar207;
                            if ((((int)lVar122 != 0 || (int)lVar121 != 0) || (int)lVar134 != 0) &&
                               ((1 << ((char)lVar134 + cVar179 & 0x1fU) & uVar28) != 0)) {
                              dVar209 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                          (iVar89 + (int)lVar122) * lVar33 +
                                                          (long)(iVar152 + (int)lVar134)];
                              dVar189 = dVar209;
                              if (dVar209 <= dVar222) {
                                dVar189 = dVar222;
                              }
                              dVar222 = dVar189;
                              if (dVar207 <= dVar209) {
                                dVar209 = dVar207;
                              }
                            }
                            dVar207 = dVar209;
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar209 = (((pdVar55 + lVar168 + lVar110 + ((iVar151 - iVar19) + 1))[lVar58] -
                                 dVar195) * dVar224 +
                                (pdVar55[lVar168 + lVar110 + ((iVar151 - iVar19) + 1)] - dVar200) *
                                dVar199 + (0.5 - dVar196) * dVar203 + dVar217) - dVar217;
                      if (dVar209 <= 1e-13) {
                        dVar222 = 1.0;
                        if ((dVar209 < -1e-13) &&
                           (dVar222 = (dVar207 - dVar217) / dVar209, 1.0 <= dVar222)) {
                          dVar222 = 1.0;
                        }
                      }
                      else {
                        dVar222 = (dVar222 - dVar217) / dVar209;
                        if (1.0 <= dVar222) {
                          dVar222 = 1.0;
                        }
                      }
                      if (dVar218 <= dVar222) {
                        dVar222 = dVar218;
                      }
                    }
                    dVar218 = dVar222;
                    if ((uVar28 >> 0x11 & 1) != 0) {
                      cVar135 = '\x05';
                      dVar207 = dVar217;
                      dVar218 = dVar217;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar179 = cVar135;
                        for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 2; lVar134 = lVar134 + 1) {
                            dVar209 = dVar207;
                            if (((int)lVar134 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar179 + (char)lVar134 & 0x1fU) & uVar28) != 0)) {
                              dVar209 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                          (iVar89 + (int)lVar122) * lVar33 +
                                                          (long)(iVar166 + (int)lVar134)];
                              dVar189 = dVar209;
                              if (dVar209 <= dVar218) {
                                dVar189 = dVar218;
                              }
                              dVar218 = dVar189;
                              if (dVar207 <= dVar209) {
                                dVar209 = dVar207;
                              }
                            }
                            dVar207 = dVar209;
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar209 = (((pdVar55 + lVar168 + lVar110 + (lVar132 - iVar19))[lVar58] -
                                 dVar195) * dVar224 +
                                (pdVar55[lVar168 + lVar110 + (lVar132 - iVar19)] - dVar200) *
                                dVar199 + (dVar217 - (dVar196 + 0.5) * dVar203)) - dVar217;
                      if (dVar209 <= 1e-13) {
                        dVar218 = 1.0;
                        if ((dVar209 < -1e-13) &&
                           (dVar218 = (dVar207 - dVar217) / dVar209, 1.0 <= dVar218)) {
                          dVar218 = 1.0;
                        }
                      }
                      else {
                        dVar218 = (dVar218 - dVar217) / dVar209;
                        if (1.0 <= dVar218) {
                          dVar218 = 1.0;
                        }
                      }
                      if (dVar222 <= dVar218) {
                        dVar218 = dVar222;
                      }
                    }
                    dVar222 = dVar218;
                    if ((uVar28 >> 0x1b & 1) != 0) {
                      cVar135 = '\x0e';
                      dVar207 = dVar217;
                      dVar222 = dVar217;
                      for (lVar121 = 0; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar179 = cVar135;
                        for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            uVar210 = SUB84(dVar207,0);
                            uVar212 = (undefined4)((ulong)dVar207 >> 0x20);
                            uVar211 = uVar210;
                            uVar213 = uVar212;
                            if (((int)lVar134 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar179 + (char)lVar134 & 0x1fU) & uVar28) != 0)) {
                              dVar209 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                          (iVar89 + (int)lVar122) * lVar33 +
                                                          (long)(iVar166 + (int)lVar134)];
                              dVar189 = dVar209;
                              if (dVar209 <= dVar222) {
                                dVar189 = dVar222;
                              }
                              dVar222 = dVar189;
                              uVar211 = SUB84(dVar209,0);
                              uVar213 = (int)((ulong)dVar209 >> 0x20);
                              if (dVar207 <= dVar209) {
                                uVar211 = uVar210;
                                uVar213 = uVar212;
                              }
                            }
                            dVar207 = (double)CONCAT44(uVar213,uVar211);
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar209 = ((0.5 - dVar195) * dVar224 +
                                dVar193 * dVar199 + dVar192 * dVar203 + dVar217) - dVar217;
                      if (dVar209 <= 1e-13) {
                        dVar222 = 1.0;
                        if ((dVar209 < -1e-13) &&
                           (dVar222 = (dVar207 - dVar217) / dVar209, 1.0 <= dVar222)) {
                          dVar222 = 1.0;
                        }
                      }
                      else {
                        dVar222 = (dVar222 - dVar217) / dVar209;
                        if (1.0 <= dVar222) {
                          dVar222 = 1.0;
                        }
                      }
                      if (dVar218 <= dVar222) {
                        dVar222 = dVar218;
                      }
                    }
                    dVar218 = dVar222;
                    if ((uVar28 >> 9 & 1) != 0) {
                      cVar135 = '\x05';
                      dVar207 = dVar217;
                      dVar218 = dVar217;
                      for (lVar121 = -1; lVar121 != 1; lVar121 = lVar121 + 1) {
                        cVar179 = cVar135;
                        for (lVar122 = -1; lVar122 != 2; lVar122 = lVar122 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            dVar209 = dVar207;
                            if (((int)lVar134 != 1 || ((int)lVar122 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar179 + (char)lVar134 & 0x1fU) & uVar28) != 0)) {
                              dVar209 = pdVar32[lVar130 + (iVar88 + (int)lVar121) * lVar31 +
                                                          (iVar89 + (int)lVar122) * lVar33 +
                                                          (long)(iVar166 + (int)lVar134)];
                              dVar189 = dVar209;
                              if (dVar209 <= dVar218) {
                                dVar189 = dVar218;
                              }
                              dVar218 = dVar189;
                              if (dVar207 <= dVar209) {
                                dVar209 = dVar207;
                              }
                            }
                            dVar207 = dVar209;
                          }
                          cVar179 = cVar179 + '\x03';
                        }
                        cVar135 = cVar135 + '\t';
                      }
                      dVar196 = ((((pdVar63 + lVar115 + lVar133 + (lVar1 - iVar23) * lVar65)[lVar66]
                                  - dVar200) * dVar199 +
                                 (pdVar63[lVar115 + lVar133 + (lVar1 - iVar23) * lVar65] - dVar196)
                                 * dVar203 + dVar217) - (dVar195 + 0.5) * dVar224) - dVar217;
                      if (dVar196 <= 1e-13) {
                        dVar218 = 1.0;
                        if ((dVar196 < -1e-13) &&
                           (dVar218 = (dVar207 - dVar217) / dVar196, 1.0 <= dVar218)) {
                          dVar218 = 1.0;
                        }
                      }
                      else {
                        dVar218 = (dVar218 - dVar217) / dVar196;
                        if (1.0 <= dVar218) {
                          dVar218 = 1.0;
                        }
                      }
                      if (dVar222 <= dVar218) {
                        dVar218 = dVar222;
                      }
                    }
                    dVar196 = 0.0;
                    if (1 < iVar158) {
                      dVar196 = dVar218;
                    }
                    dVar200 = 0.0;
                    if (1 < iVar127) {
                      dVar200 = dVar218;
                    }
                    dVar222 = 0.0;
                    if (1 < iVar141) {
                      dVar222 = dVar218;
                    }
                    if ((local_978 == 1.0) && (!NAN(local_978))) {
                      if ((pdVar50[lVar112 + lVar93 + (int)(iVar151 + ~uVar15)] == 1.0) &&
                         (((!NAN(pdVar50[lVar112 + lVar93 + (int)(iVar151 + ~uVar15)]) &&
                           (pdVar50[lVar112 + lVar93 + (int)((iVar151 - uVar15) + 1)] == 1.0)) &&
                          (!NAN(pdVar50[lVar112 + lVar93 + (int)((iVar151 - uVar15) + 1)]))))) {
                        dVar196 = 1.0;
                      }
                      if (((pdVar50[lVar171 + lVar93 + lVar138] == 1.0) &&
                          (!NAN(pdVar50[lVar171 + lVar93 + lVar138]))) &&
                         ((pdVar50[lVar178 + lVar93 + lVar138] == 1.0 &&
                          (!NAN(pdVar50[lVar178 + lVar93 + lVar138]))))) {
                        dVar200 = 1.0;
                      }
                      if (((dVar204 == 1.0) && (!NAN(dVar204))) &&
                         ((pdVar50[lVar112 + lVar138 + lVar107] == 1.0 &&
                          (!NAN(pdVar50[lVar112 + lVar138 + lVar107]))))) {
                        dVar222 = 1.0;
                      }
                    }
                    dVar204 = (0.5 - dVar195) * dVar224 * dVar222 +
                              dVar193 * dVar199 * dVar200 + dVar192 * dVar203 * dVar196 + dVar217;
                    if (dVar204 <= dVar223) {
                      dVar223 = dVar204;
                    }
                    if (dVar220 <= dVar223) {
                      dVar220 = dVar223;
                    }
                    dVar220 = pdVar35[lVar114 + lVar154 + lVar38 * 2 + (lVar132 - lVar159)] *
                              dVar187 * -0.5 * dVar224 * dVar222 + dVar220;
                  }
                  else {
                    dVar220 = pdVar50[lVar112 + lVar138 + lVar95];
                    if (((pdVar50[lVar112 + lVar138 + lVar94] != 1.0) ||
                        (NAN(pdVar50[lVar112 + lVar138 + lVar94]))) ||
                       ((dVar220 != 1.0 || (NAN(dVar220))))) {
                      if ((dVar220 != 1.0) || (NAN(dVar220))) goto LAB_003e6733;
LAB_003e7ef6:
                      lVar122 = lVar132 - lVar177;
                      dVar220 = pdVar32[lVar113 + lVar122 + lVar96 + lVar130];
                      dVar195 = dVar220 - pdVar32[lVar113 + lVar122 + lVar98 + lVar130];
                      dVar196 = pdVar32[lVar113 + lVar122 + lVar99 + lVar130] - dVar220;
                      dVar195 = dVar195 + dVar195;
                      dVar196 = dVar196 + dVar196;
                      dVar216 = (pdVar32[lVar113 + lVar122 + lVar99 + lVar130] -
                                pdVar32[lVar113 + lVar122 + lVar98 + lVar130]) * 0.5;
                      dVar193 = ABS(dVar195);
                      uVar186 = -(ulong)(0.0 < dVar216);
                      dVar216 = ABS(dVar216);
                      dVar192 = ABS(dVar196);
                      if (dVar193 <= dVar216) {
                        dVar216 = dVar193;
                      }
                      if (dVar216 <= dVar192) {
                        dVar192 = dVar216;
                      }
                      uVar191 = -(ulong)(0.0 < dVar195 * dVar196) & (ulong)dVar192;
                      dVar216 = (double)(~uVar186 & (uVar191 ^ 0x8000000000000000) |
                                        uVar186 & uVar191) *
                                (-1.0 - pdVar35[lVar114 + lVar97 + lVar38 * 2 + (lVar132 - lVar159)]
                                        * dVar187) * 0.5;
                    }
                    else {
                      if ((pdVar50[lVar112 + lVar138 + ((lVar131 + 2) - lVar167) * lVar52] != 1.0)
                         || (NAN(pdVar50[lVar112 + lVar138 + ((lVar131 + 2) - lVar167) * lVar52])))
                      goto LAB_003e7ef6;
                      lVar122 = lVar132 - lVar177;
                      dVar220 = pdVar32[lVar113 + lVar122 + lVar96 + lVar130];
                      dVar193 = dVar220 - pdVar32[lVar113 + lVar122 + lVar98 + lVar130];
                      dVar195 = pdVar32[lVar113 + lVar122 + lVar98 + lVar130] -
                                pdVar32[lVar113 + lVar122 + lVar100 + lVar130];
                      dVar216 = 0.0;
                      dVar192 = 0.0;
                      if (0.0 <= dVar193 * dVar195) {
                        dVar192 = ABS(dVar193);
                        if (ABS(dVar195) <= ABS(dVar193)) {
                          dVar192 = ABS(dVar195);
                        }
                        dVar192 = dVar192 + dVar192;
                      }
                      dVar196 = pdVar32[lVar113 + lVar122 + ((lVar131 + 2) - lVar176) * lVar31 +
                                                            lVar130] -
                                pdVar32[lVar113 + lVar122 + lVar99 + lVar130];
                      dVar222 = pdVar32[lVar113 + lVar122 + lVar99 + lVar130] - dVar220;
                      dVar200 = (dVar222 + dVar196) * 0.5;
                      if (0.0 <= dVar222 * dVar196) {
                        dVar216 = ABS(dVar196);
                        if (ABS(dVar222) <= ABS(dVar196)) {
                          dVar216 = ABS(dVar222);
                        }
                        dVar216 = dVar216 + dVar216;
                      }
                      dVar217 = (dVar193 + dVar222) * 0.5;
                      dVar196 = 0.0;
                      if (0.0 <= dVar193 * dVar222) {
                        dVar196 = ABS(dVar222);
                        if (ABS(dVar193) <= ABS(dVar222)) {
                          dVar196 = ABS(dVar193);
                        }
                        dVar196 = dVar196 + dVar196;
                      }
                      dVar195 = (dVar193 + dVar195) * 0.5;
                      dVar193 = ABS(dVar195);
                      if (dVar192 <= dVar193) {
                        dVar193 = dVar192;
                      }
                      dVar192 = ABS(dVar200);
                      if (dVar216 <= dVar192) {
                        dVar192 = dVar216;
                      }
                      dVar216 = ABS(dVar217 * 1.3333333333333333 +
                                    (dVar192 * (double)((ulong)dVar200 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar193 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar196 <= dVar216) {
                        dVar216 = dVar196;
                      }
                      dVar216 = dVar216 * (double)((ulong)dVar217 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (-1.0 - pdVar35[lVar114 + lVar97 + lVar38 * 2 + (lVar132 - lVar159)]
                                        * dVar187) * 0.5;
                    }
                    dVar216 = dVar216 + dVar220;
LAB_003e8008:
                    dVar220 = pdVar50[lVar112 + lVar138 + lVar107];
                    if ((((((dVar220 != 1.0) || (NAN(dVar220))) || (dVar204 != 1.0)) ||
                         ((NAN(dVar204) ||
                          (pdVar50[lVar112 + lVar138 + ((iVar126 + -3) - iVar17) * lVar52] != 1.0)))
                         ) || (NAN(pdVar50[lVar112 + lVar138 + ((iVar126 + -3) - iVar17) * lVar52]))
                        ) || ((pdVar50[lVar112 + lVar138 + lVar106] != 1.0 ||
                              (NAN(pdVar50[lVar112 + lVar138 + lVar106]))))) {
                      if ((dVar204 != 1.0) ||
                         (((NAN(dVar204) || (dVar220 != 1.0)) || (NAN(dVar220))))) {
                        iVar152 = iVar151 - iVar4;
                        lVar134 = (long)iVar152;
                        lVar133 = lVar132 - lVar185;
                        bVar82 = true;
                        local_978 = 1.0;
                        goto LAB_003e83fb;
                      }
                      lVar121 = lVar132 - lVar177;
                      dVar204 = pdVar32[lVar113 + lVar121 + lVar98 + lVar130];
                      dVar193 = dVar204 - pdVar32[lVar113 + lVar121 + lVar136 + lVar130];
                      dVar195 = pdVar32[lVar113 + lVar121 + lVar96 + lVar130] - dVar204;
                      dVar193 = dVar193 + dVar193;
                      dVar195 = dVar195 + dVar195;
                      dVar192 = (pdVar32[lVar113 + lVar121 + lVar96 + lVar130] -
                                pdVar32[lVar113 + lVar121 + lVar136 + lVar130]) * 0.5;
                      dVar196 = ABS(dVar193);
                      uVar186 = -(ulong)(0.0 < dVar192);
                      dVar192 = ABS(dVar192);
                      dVar220 = ABS(dVar195);
                      if (dVar196 <= dVar192) {
                        dVar192 = dVar196;
                      }
                      if (dVar192 <= dVar220) {
                        dVar220 = dVar192;
                      }
                      uVar191 = -(ulong)(0.0 < dVar193 * dVar195) & (ulong)dVar220;
                      dVar220 = (double)(~uVar186 & (uVar191 ^ 0x8000000000000000) |
                                        uVar186 & uVar191) *
                                (1.0 - pdVar35[lVar114 + lVar154 + lVar38 * 2 + (lVar132 - lVar159)]
                                       * dVar187) * 0.5;
                    }
                    else {
                      lVar121 = lVar132 - lVar177;
                      dVar204 = pdVar32[lVar113 + lVar121 + lVar98 + lVar130];
                      dVar193 = dVar204 - pdVar32[lVar113 + lVar121 + lVar136 + lVar130];
                      dVar195 = pdVar32[lVar113 + lVar121 + lVar136 + lVar130] -
                                pdVar32[lVar113 + lVar121 + ((iVar126 + -3) - iVar172) * lVar31 +
                                                            lVar130];
                      dVar192 = 0.0;
                      dVar220 = 0.0;
                      if (0.0 <= dVar193 * dVar195) {
                        dVar220 = ABS(dVar193);
                        if (ABS(dVar195) <= ABS(dVar193)) {
                          dVar220 = ABS(dVar195);
                        }
                        dVar220 = dVar220 + dVar220;
                      }
                      dVar196 = pdVar32[lVar113 + lVar121 + (iVar157 - iVar172) * lVar31 + lVar130]
                                - pdVar32[lVar113 + lVar121 + lVar96 + lVar130];
                      dVar222 = pdVar32[lVar113 + lVar121 + lVar96 + lVar130] - dVar204;
                      dVar200 = (dVar222 + dVar196) * 0.5;
                      if (0.0 <= dVar222 * dVar196) {
                        dVar192 = ABS(dVar196);
                        if (ABS(dVar222) <= ABS(dVar196)) {
                          dVar192 = ABS(dVar222);
                        }
                        dVar192 = dVar192 + dVar192;
                      }
                      dVar217 = (dVar193 + dVar222) * 0.5;
                      dVar196 = 0.0;
                      if (0.0 <= dVar193 * dVar222) {
                        dVar196 = ABS(dVar222);
                        if (ABS(dVar193) <= ABS(dVar222)) {
                          dVar196 = ABS(dVar193);
                        }
                        dVar196 = dVar196 + dVar196;
                      }
                      dVar195 = (dVar193 + dVar195) * 0.5;
                      dVar193 = ABS(dVar195);
                      if (dVar220 <= dVar193) {
                        dVar193 = dVar220;
                      }
                      dVar220 = ABS(dVar200);
                      if (dVar192 <= dVar220) {
                        dVar220 = dVar192;
                      }
                      dVar220 = ABS(dVar217 * 1.3333333333333333 +
                                    (dVar220 * (double)((ulong)dVar200 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar193 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar196 <= dVar220) {
                        dVar220 = dVar196;
                      }
                      dVar220 = dVar220 * (double)((ulong)dVar217 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (1.0 - pdVar35[lVar114 + lVar154 + lVar38 * 2 + (lVar132 - lVar159)]
                                       * dVar187) * 0.5;
                    }
                    dVar220 = dVar220 + dVar204;
                  }
                }
                pdVar43[lVar140 * lVar46 +
                        (int)(~uVar13 + iVar126) * lVar45 + lVar119 * lVar44 + (lVar132 - iVar11)] =
                     dVar220;
                pdVar39[lVar140 * lVar42 +
                        (lVar131 - iVar10) * lVar41 + lVar120 * lVar40 + (lVar132 - iVar7)] =
                     dVar216;
                lVar132 = lVar132 + 1;
                local_7b0 = local_7b0 + 1;
                local_7b8 = local_7b8 + 1;
                local_7a8 = local_7a8 + 1;
                iVar81 = iVar81 + 1;
                iVar80 = iVar80 + 1;
                local_7c0 = local_7c0 + 1;
                lVar121 = lVar3;
              } while (iVar25 + 1 != (int)lVar132);
            }
          }
          local_878 = local_878 + lVar30;
          local_870 = local_870 + lVar30;
          local_868 = local_868 + lVar30;
          local_908 = local_908 + lVar31;
          lVar131 = lVar2;
        }
        lVar140 = lVar140 + 1;
        local_8b0 = local_8b0 + lVar34;
      } while( true );
    }
  }
  else {
    iVar7 = (zebox->bigend).vect[0];
  }
  A[0][0] = (Real)q->p;
  A[0][1] = (Real)q->jstride;
  A[0][2] = (Real)q->kstride;
  A[1][0] = (Real)q->nstride;
  A[1][1] = *(Real *)&q->begin;
  uVar68 = *(undefined8 *)&(q->begin).z;
  uVar69 = (q->end).y;
  A[2]._4_8_ = *(undefined8 *)&(q->end).z;
  A[1][2]._0_4_ = (undefined4)uVar68;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[2][2] = (Real)ccvel->p;
  A[3][0] = (Real)ccvel->jstride;
  A[3][1] = (Real)ccvel->kstride;
  A[3][2] = (Real)ccvel->nstride;
  A[4][0] = *(Real *)&ccvel->begin;
  uVar70 = (ccvel->end).x;
  uVar71 = (ccvel->end).y;
  A._116_8_ = *(undefined8 *)&(ccvel->end).z;
  A[4][1]._0_4_ = (undefined4)*(undefined8 *)&(ccvel->begin).z;
  A[6][1] = (Real)Imz->p;
  A[6][2] = (Real)Imz->jstride;
  A[7][0] = (Real)Imz->kstride;
  A[7][1] = (Real)Imz->nstride;
  A[7][2] = *(Real *)&Imz->begin;
  uVar68 = *(undefined8 *)&(Imz->begin).z;
  uVar72 = (Imz->end).y;
  A[8]._12_8_ = *(undefined8 *)&(Imz->end).z;
  A[8][0]._0_4_ = (undefined4)uVar68;
  A[8][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[9][0] = (Real)Ipz->p;
  A[9][1] = (Real)Ipz->jstride;
  A[9][2] = (Real)Ipz->kstride;
  A[10][0] = (Real)Ipz->nstride;
  A[10][1] = *(Real *)&Ipz->begin;
  uVar73 = (Ipz->end).x;
  uVar74 = (Ipz->end).y;
  A[0xb]._4_8_ = *(undefined8 *)&(Ipz->end).z;
  A[10][2]._0_4_ = (undefined4)*(undefined8 *)&(Ipz->begin).z;
  A[0xc][0] = (Real)pbc;
  A[0xc][1] = (Real)flag->p;
  A[0xc][2] = (Real)flag->jstride;
  A[0xd][0] = (Real)flag->kstride;
  A[0xd][1] = (Real)flag->nstride;
  A[0xd][2] = *(Real *)&flag->begin;
  uVar68 = *(undefined8 *)&(flag->begin).z;
  uVar75 = (flag->end).y;
  A[0xe]._12_8_ = *(undefined8 *)&(flag->end).z;
  A[0xe][0]._0_4_ = (undefined4)uVar68;
  A[0xe][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0xf][0] = (Real)vfrac->p;
  A[0xf][1] = (Real)vfrac->jstride;
  A[0xf][2] = (Real)vfrac->kstride;
  A[0x10][0] = (Real)vfrac->nstride;
  A[0x10][1] = *(Real *)&vfrac->begin;
  uVar68 = *(undefined8 *)&(vfrac->begin).z;
  uVar76 = (vfrac->end).y;
  A[0x11]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x10][2]._0_4_ = (undefined4)uVar68;
  A[0x10][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x11][2] = (Real)ccc->p;
  A[0x12][0] = (Real)ccc->jstride;
  A[0x12][1] = (Real)ccc->kstride;
  A[0x12][2] = (Real)ccc->nstride;
  A[0x13][0] = *(Real *)&ccc->begin;
  uVar68 = *(undefined8 *)&(ccc->begin).z;
  uVar77 = (ccc->end).y;
  A._476_8_ = *(undefined8 *)&(ccc->end).z;
  A[0x13][1]._0_4_ = (undefined4)uVar68;
  A[0x13][1]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x14][1] = (Real)fcx->p;
  A[0x14][2] = (Real)fcx->jstride;
  A[0x15][0] = (Real)fcx->kstride;
  A[0x15][1] = (Real)fcx->nstride;
  A[0x15][2] = *(Real *)&fcx->begin;
  uVar68 = *(undefined8 *)&(fcx->begin).z;
  uVar78 = (fcx->end).y;
  A[0x16]._12_8_ = *(undefined8 *)&(fcx->end).z;
  A[0x16][0]._0_4_ = (undefined4)uVar68;
  A[0x16][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x17][0] = (Real)fcy->p;
  A[0x17][1] = (Real)fcy->jstride;
  A[0x17][2] = (Real)fcy->kstride;
  A[0x18][0] = (Real)fcy->nstride;
  A[0x18][1] = *(Real *)&fcy->begin;
  uVar68 = *(undefined8 *)&(fcy->begin).z;
  uVar79 = (fcy->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x18][2]._0_4_ = (undefined4)uVar68;
  A[0x18][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x19][2] = (Real)fcz->p;
  A[0x1a][0] = (Real)fcz->jstride;
  A[0x1a][1] = (Real)fcz->kstride;
  A[0x1a][2] = (Real)fcz->nstride;
  iVar9 = (zebox->smallend).vect[0];
  iVar10 = (zebox->smallend).vect[1];
  iVar11 = (zebox->smallend).vect[2];
  iVar12 = (zebox->bigend).vect[1];
  iVar14 = (zebox->bigend).vect[2];
  A[2][0]._0_4_ = uVar69;
  A[4][1]._4_4_ = uVar70;
  A[4][2]._0_4_ = uVar71;
  A[5][1]._0_4_ = iVar175;
  A[5][1]._4_4_ = iVar181;
  A[5][2]._0_4_ = iVar5;
  A[5][2]._4_4_ = iVar172;
  A[6][0]._0_4_ = iVar4;
  A[6][0]._4_4_ = iVar6;
  A[8][1]._0_4_ = uVar72;
  A[10][2]._4_4_ = uVar73;
  A[0xb][0]._0_4_ = uVar74;
  A[0xb][2] = dVar187;
  A[0xe][1]._0_4_ = uVar75;
  A[0x11][0]._0_4_ = uVar76;
  A[0x13][2]._0_4_ = uVar77;
  A[0x16][1]._0_4_ = uVar78;
  A[0x19][0]._0_4_ = uVar79;
  for (iVar143 = 0; iVar175 = iVar11, iVar143 != 3; iVar143 = iVar143 + 1) {
    for (; iVar181 = iVar10, iVar175 <= iVar14; iVar175 = iVar175 + 1) {
      for (; iVar181 <= iVar12; iVar181 = iVar181 + 1) {
        iVar172 = iVar9;
        if (iVar9 <= iVar7) {
          do {
            PredictVelOnZFace::anon_class_680_18_41abcaaf::operator()
                      ((anon_class_680_18_41abcaaf *)A,iVar172,iVar181,iVar175,iVar143);
            iVar172 = iVar172 + 1;
          } while (iVar7 + 1 != iVar172);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnZFace (Box const& zebox,
                          Array4<Real> const& Imz, Array4<Real> const& Ipz,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) + delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];


                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}